

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrend1.c
# Opt level: O2

FT_Error ft_raster1_render(FT_Renderer_conflict render,FT_GlyphSlot slot,FT_Render_Mode mode,
                          FT_Vector *origin)

{
  FT_UInt *pFVar1;
  FT_Memory memory;
  FT_Bool FVar2;
  uchar *puVar3;
  long xOffset;
  long yOffset;
  FT_Error error;
  FT_Outline *local_98;
  FT_Raster_Params params;
  
  error = 0;
  memory = (render->root).memory;
  local_98 = &slot->outline;
  if (slot->format == render->glyph_format) {
    if (mode != FT_RENDER_MODE_MONO) {
      return 0x13;
    }
    if ((slot->internal->flags & 1) != 0) {
      ft_mem_free(memory,(slot->bitmap).buffer);
      (slot->bitmap).buffer = (uchar *)0x0;
      pFVar1 = &slot->internal->flags;
      *pFVar1 = *pFVar1 & 0xfffffffe;
    }
    FVar2 = ft_glyphslot_preset_bitmap(slot,FT_RENDER_MODE_MONO,origin);
    if (FVar2 != '\0') {
      error = 0x62;
      goto LAB_001fd8a2;
    }
    yOffset = 0;
    puVar3 = (uchar *)ft_mem_realloc(memory,(long)(slot->bitmap).pitch,0,(ulong)(slot->bitmap).rows,
                                     (void *)0x0,&error);
    (slot->bitmap).buffer = puVar3;
    xOffset = 0;
    if (error == 0) {
      pFVar1 = &slot->internal->flags;
      *pFVar1 = *pFVar1 | 1;
      xOffset = (long)(slot->bitmap_left * -0x40);
      yOffset = ((long)(int)(slot->bitmap).rows - (long)slot->bitmap_top) * 0x40;
      if (origin != (FT_Vector *)0x0) {
        xOffset = xOffset + origin->x;
        yOffset = yOffset + origin->y;
      }
      if (xOffset != 0 || yOffset != 0) {
        FT_Outline_Translate(local_98,xOffset,yOffset);
      }
      params.source = local_98;
      params.flags = 0;
      params.target = &slot->bitmap;
      error = (*render->raster_render)(render->raster,&params);
      if (error == 0) {
        slot->format = FT_GLYPH_FORMAT_BITMAP;
        goto LAB_001fd8d6;
      }
    }
  }
  else {
    error = 6;
LAB_001fd8a2:
    yOffset = 0;
    xOffset = 0;
  }
  if ((slot->internal->flags & 1) != 0) {
    ft_mem_free(memory,(slot->bitmap).buffer);
    (slot->bitmap).buffer = (uchar *)0x0;
    pFVar1 = &slot->internal->flags;
    *pFVar1 = *pFVar1 & 0xfffffffe;
  }
LAB_001fd8d6:
  if (xOffset != 0 || yOffset != 0) {
    FT_Outline_Translate(local_98,-xOffset,-yOffset);
  }
  return error;
}

Assistant:

static FT_Error
  ft_raster1_render( FT_Renderer       render,
                     FT_GlyphSlot      slot,
                     FT_Render_Mode    mode,
                     const FT_Vector*  origin )
  {
    FT_Error     error   = FT_Err_Ok;
    FT_Outline*  outline = &slot->outline;
    FT_Bitmap*   bitmap  = &slot->bitmap;
    FT_Memory    memory  = render->root.memory;
    FT_Pos       x_shift = 0;
    FT_Pos       y_shift = 0;

    FT_Raster_Params  params;


    /* check glyph image format */
    if ( slot->format != render->glyph_format )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* check rendering mode */
    if ( mode != FT_RENDER_MODE_MONO )
    {
      /* raster1 is only capable of producing monochrome bitmaps */
      return FT_THROW( Cannot_Render_Glyph );
    }

    /* release old bitmap buffer */
    if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    if ( ft_glyphslot_preset_bitmap( slot, mode, origin ) )
    {
      error = FT_THROW( Raster_Overflow );
      goto Exit;
    }

    /* allocate new one */
    if ( FT_ALLOC_MULT( bitmap->buffer, bitmap->rows, bitmap->pitch ) )
      goto Exit;

    slot->internal->flags |= FT_GLYPH_OWN_BITMAP;

    x_shift = -slot->bitmap_left * 64;
    y_shift = ( (FT_Int)bitmap->rows - slot->bitmap_top ) * 64;

    if ( origin )
    {
      x_shift += origin->x;
      y_shift += origin->y;
    }

    /* translate outline to render it into the bitmap */
    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, x_shift, y_shift );

    /* set up parameters */
    params.target = bitmap;
    params.source = outline;
    params.flags  = FT_RASTER_FLAG_DEFAULT;

    /* render outline into the bitmap */
    error = render->raster_render( render->raster, &params );

  Exit:
    if ( !error )
      /* everything is fine; the glyph is now officially a bitmap */
      slot->format = FT_GLYPH_FORMAT_BITMAP;
    else if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, -x_shift, -y_shift );

    return error;
  }